

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_manipulate.c
# Opt level: O3

int light_add_option(light_pcapng section,light_pcapng pcapng,light_option option,light_boolean copy
                    )

{
  light_boolean lVar1;
  size_t sVar2;
  _light_option *p_Var3;
  _light_option *p_Var4;
  int iVar5;
  
  if (option == (light_option)0x0) {
    iVar5 = -3;
  }
  else {
    if (copy == LIGHT_TRUE) {
      option = __copy_option(option);
    }
    sVar2 = __get_option_total_size(option);
    p_Var4 = option;
    p_Var3 = pcapng->options;
    if (pcapng->options == (_light_option *)0x0) {
      do {
        p_Var3 = p_Var4;
        p_Var4 = p_Var3->next_option;
      } while (p_Var3->next_option != (_light_option *)0x0);
      if (p_Var3->custom_option_code != 0) {
        p_Var4 = (_light_option *)calloc(1,0x18);
        p_Var3->next_option = p_Var4;
        sVar2 = sVar2 + 4;
      }
      pcapng->options = option;
    }
    else {
      do {
        p_Var4 = p_Var3;
        p_Var3 = p_Var4->next_option;
        if (p_Var3 == (_light_option *)0x0) break;
      } while (p_Var3->custom_option_code != 0);
      p_Var4->next_option = option;
      option->next_option = p_Var3;
    }
    pcapng->block_total_lenght = pcapng->block_total_lenght + (int)sVar2;
    lVar1 = __is_section_header(section);
    if (lVar1 == LIGHT_TRUE) {
      *(size_t *)(section->block_body + 2) = *(long *)(section->block_body + 2) + sVar2;
      iVar5 = 0;
    }
    else {
      iVar5 = 0;
      if (section != (light_pcapng)0x0) {
        light_add_option_cold_1();
      }
    }
  }
  return iVar5;
}

Assistant:

int light_add_option(light_pcapng section, light_pcapng pcapng, light_option option, light_boolean copy)
{
	size_t option_size = 0;
	light_option option_list = NULL;

	if (option == NULL) {
		return LIGHT_INVALID_ARGUMENT;
	}

	if (copy == LIGHT_TRUE) {
		option_list = __copy_option(option);
	}
	else {
		option_list = option;
	}

	option_size = __get_option_total_size(option_list);

	if (pcapng->options == NULL) {
		light_option iterator = option_list;
		while (iterator->next_option != NULL) {
			iterator = iterator->next_option;
		}

		if (iterator->custom_option_code != 0) {
			// Add terminator option.
			iterator->next_option = calloc(1, sizeof(struct _light_option));
			option_size += 4;
		}
		pcapng->options = option_list;
	}
	else {
		light_option current = pcapng->options;
		while (current->next_option && current->next_option->custom_option_code != 0) {
			current = current->next_option;
		}

		light_option opt_endofopt = current->next_option;
		current->next_option = option_list;
		option_list->next_option = opt_endofopt;
	}

	pcapng->block_total_lenght += option_size;

	if (__is_section_header(section) == 1) {
		struct _light_section_header *shb = (struct _light_section_header *)section->block_body;
		shb->section_length += option_size;
	}
	else if (section != NULL) {
		PCAPNG_WARNING("PCAPNG block is not section header!");
	}

	return LIGHT_SUCCESS;
}